

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadTable
          (BinaryReader *this,Type *out_elem_type,Limits *out_elem_limits)

{
  bool bVar1;
  bool bVar2;
  Result RVar3;
  uint8_t unknown_flags;
  bool is_64;
  bool is_shared;
  bool has_max;
  uint local_34;
  uint32_t max;
  uint32_t initial;
  uint8_t flags;
  Limits *pLStack_28;
  Limits *out_elem_limits_local;
  Type *out_elem_type_local;
  BinaryReader *this_local;
  
  pLStack_28 = out_elem_limits;
  out_elem_limits_local = (Limits *)out_elem_type;
  out_elem_type_local = (Type *)this;
  initial = (uint32_t)ReadRefType(this,out_elem_type,"table elem type");
  bVar1 = Failed((Result)initial);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    _unknown_flags = 0;
    RVar3 = ReadU8(this,(uint8_t *)((long)&max + 3),"table flags");
    bVar1 = Failed(RVar3);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      bVar1 = (max._3_1_ & 1) != 0;
      if ((max._3_1_ & 2) == 0) {
        if ((max._3_1_ & 4) == 0) {
          if ((max._3_1_ & 0xf8) == 0) {
            RVar3 = ReadU32Leb128(this,&local_34,"table initial elem count");
            bVar2 = Failed(RVar3);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
            }
            else {
              if (bVar1) {
                RVar3 = ReadU32Leb128(this,(uint32_t *)&unknown_flags,"table max elem count");
                bVar2 = Failed(RVar3);
                if (bVar2) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  return (Result)this_local._4_4_;
                }
              }
              pLStack_28->has_max = bVar1;
              pLStack_28->initial = (ulong)local_34;
              pLStack_28->max = (ulong)_unknown_flags;
              Result::Result((Result *)((long)&this_local + 4),Ok);
            }
          }
          else {
            PrintError(this,"malformed table limits flag: %d",(ulong)max._3_1_);
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"tables may not be 64-bit");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"tables may not be shared");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadTable(Type* out_elem_type, Limits* out_elem_limits) {
  CHECK_RESULT(ReadRefType(out_elem_type, "table elem type"));

  uint8_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU8(&flags, "table flags"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  bool is_64 = flags & WABT_BINARY_LIMITS_IS_64_FLAG;
  const uint8_t unknown_flags = flags & ~WABT_BINARY_LIMITS_ALL_FLAGS;
  ERROR_IF(is_shared, "tables may not be shared");
  ERROR_IF(is_64, "tables may not be 64-bit");
  ERROR_UNLESS(unknown_flags == 0, "malformed table limits flag: %d", flags);
  CHECK_RESULT(ReadU32Leb128(&initial, "table initial elem count"));
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "table max elem count"));
  }

  out_elem_limits->has_max = has_max;
  out_elem_limits->initial = initial;
  out_elem_limits->max = max;
  return Result::Ok;
}